

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O0

void Map_MappingSetRefs(Map_Man_t *pMan)

{
  Map_Node_t *pMVar1;
  int iVar2;
  int local_1c;
  int i;
  Map_Node_t *pNode;
  Map_Man_t *pMan_local;
  
  if (pMan->fUseProfile != 0) {
    Mio_LibraryCleanProfile2(pMan->pSuperLib->pGenlib);
  }
  for (local_1c = 0; local_1c < pMan->vMapObjs->nSize; local_1c = local_1c + 1) {
    pMVar1 = pMan->vMapObjs->pArray[local_1c];
    pMVar1->nRefAct[0] = 0;
    pMVar1->nRefAct[1] = 0;
    pMVar1->nRefAct[2] = 0;
  }
  for (local_1c = 0; local_1c < pMan->nOutputs; local_1c = local_1c + 1) {
    pMVar1 = pMan->pOutputs[local_1c];
    iVar2 = Map_NodeIsConst(pMVar1);
    if (iVar2 == 0) {
      Map_MappingSetRefs_rec(pMan,pMVar1);
    }
  }
  return;
}

Assistant:

void Map_MappingSetRefs( Map_Man_t * pMan )
{
    Map_Node_t * pNode;
    int i;
    if ( pMan->fUseProfile )
        Mio_LibraryCleanProfile2( pMan->pSuperLib->pGenlib );
    // clean all references
    for ( i = 0; i < pMan->vMapObjs->nSize; i++ )
    {
        pNode = pMan->vMapObjs->pArray[i];
        pNode->nRefAct[0] = 0;
        pNode->nRefAct[1] = 0;
        pNode->nRefAct[2] = 0;
    }
    // visit nodes reachable from POs in the DFS order through the best cuts
    for ( i = 0; i < pMan->nOutputs; i++ )
    {
        pNode = pMan->pOutputs[i];
        if ( !Map_NodeIsConst(pNode) )
            Map_MappingSetRefs_rec( pMan, pNode );
    }
}